

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

void __thiscall Block::Block(Block *this,uint32_t bIndexIn,string *bDataIn,string *merkroot)

{
  time_t tVar1;
  string *merkroot_local;
  string *bDataIn_local;
  uint32_t bIndexIn_local;
  Block *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->_bHash);
  std::__cxx11::string::string((string *)&this->merkle_root);
  std::__cxx11::string::string((string *)&this->_bData,(string *)bDataIn);
  this->_bIndex = bIndexIn;
  std::__cxx11::string::operator=((string *)&this->merkle_root,(string *)merkroot);
  this->_bNonce = -1;
  tVar1 = time((time_t *)0x0);
  this->_cTime = tVar1;
  return;
}

Assistant:

Block::Block(uint32_t bIndexIn,const string & bDataIn, string merkroot):_bIndex(bIndexIn),_bData(bDataIn){
    merkle_root = merkroot;
	_bNonce = -1;
	_cTime = time(nullptr);
}